

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllTypes.cpp
# Opt level: O3

Type * __thiscall
slang::ast::IntegralType::fromSyntax
          (IntegralType *this,Compilation *compilation,SyntaxKind integerKind,
          span<const_slang::syntax::VariableDimensionSyntax_*const,_18446744073709551615UL>
          dimensions,bool isSigned,ASTContext *context)

{
  byte bVar1;
  bitmask<slang::ast::IntegralFlags> flags;
  Type *elementType;
  undefined4 in_register_00000014;
  long lVar2;
  SyntaxKind kind;
  undefined7 in_register_00000089;
  long lVar3;
  VariableDimensionSyntax *dimSyntax;
  SmallVector<std::pair<slang::ast::EvaluatedDimension,_const_slang::syntax::SyntaxNode_*>,_4UL>
  dims;
  EvaluatedDimension dim;
  VariableDimensionSyntax *local_110;
  int *local_108;
  long local_100;
  undefined8 local_f8;
  int local_f0 [40];
  EvaluatedDimension local_50;
  
  kind = (SyntaxKind)compilation;
  local_108 = local_f0;
  local_100 = 0;
  local_f8 = 4;
  if (dimensions._M_ptr != (pointer)0x0) {
    lVar2 = 0;
    do {
      local_110 = *(VariableDimensionSyntax **)(CONCAT44(in_register_00000014,integerKind) + lVar2);
      ASTContext::evalPackedDimension
                (&local_50,(ASTContext *)CONCAT71(in_register_00000089,isSigned),local_110);
      SmallVectorBase<std::pair<slang::ast::EvaluatedDimension,slang::syntax::SyntaxNode_const*>>::
      emplace_back<slang::ast::EvaluatedDimension&,slang::syntax::VariableDimensionSyntax_const*&>
                ((SmallVectorBase<std::pair<slang::ast::EvaluatedDimension,slang::syntax::SyntaxNode_const*>>
                  *)&local_108,&local_50,&local_110);
      lVar2 = lVar2 + 8;
    } while ((long)dimensions._M_ptr << 3 != lVar2);
    if (local_100 != 0) {
      bVar1 = (kind == RegType) << 2 | 2;
      if (kind == BitType) {
        bVar1 = 0;
      }
      flags.m_bits = bVar1 | dimensions._M_extent._M_extent_value._0_1_;
      if (((local_100 == 1) && (*local_108 - 1U < 2)) && (*(ulong *)(local_108 + 1) < 0x80000000)) {
        elementType = Compilation::getType
                                ((Compilation *)this,(int)*(ulong *)(local_108 + 1) + 1,flags);
      }
      else {
        elementType = Compilation::getScalarType((Compilation *)this,flags);
        if (local_100 != 0) {
          lVar3 = local_100;
          lVar2 = local_100 * 0x28;
          do {
            elementType = PackedArrayType::fromSyntax
                                    ((((ASTContext *)CONCAT71(in_register_00000089,isSigned))->scope
                                     ).ptr,elementType,
                                     (EvaluatedDimension *)((long)local_108 + lVar2 + -0x28),
                                     *(SyntaxNode **)((long)local_108 + lVar2 + -8));
            lVar3 = lVar3 + -1;
            lVar2 = lVar2 + -0x28;
          } while (lVar3 != 0);
        }
      }
      goto LAB_0041815c;
    }
  }
  elementType = Type::getPredefinedType
                          ((Compilation *)this,kind,dimensions._M_extent._M_extent_value._0_1_);
LAB_0041815c:
  if (local_108 != local_f0) {
    operator_delete(local_108);
  }
  return elementType;
}

Assistant:

const Type& IntegralType::fromSyntax(Compilation& compilation, SyntaxKind integerKind,
                                     std::span<const VariableDimensionSyntax* const> dimensions,
                                     bool isSigned, const ASTContext& context) {
    // This is a simple integral vector (possibly of just one element).
    SmallVector<std::pair<EvaluatedDimension, const SyntaxNode*>, 4> dims;
    for (auto dimSyntax : dimensions) {
        auto dim = context.evalPackedDimension(*dimSyntax);
        dims.emplace_back(dim, dimSyntax);
    }

    if (dims.empty())
        return getPredefinedType(compilation, integerKind, isSigned);

    bitmask<IntegralFlags> flags;
    if (integerKind == SyntaxKind::RegType)
        flags |= IntegralFlags::Reg;
    if (isSigned)
        flags |= IntegralFlags::Signed;
    if (integerKind != SyntaxKind::BitType)
        flags |= IntegralFlags::FourState;

    if (dims.size() == 1 && dims[0].first.isRange()) {
        auto range = dims[0].first.range;
        if (range.right == 0 && range.left >= 0) {
            // if we have the common case of only one dimension and lsb == 0
            // then we can use the shared representation
            return compilation.getType(range.width(), flags);
        }
    }

    const Type* result = &compilation.getScalarType(flags);
    size_t count = dims.size();
    for (size_t i = 0; i < count; i++) {
        auto& pair = dims[count - i - 1];
        result = &PackedArrayType::fromSyntax(*context.scope, *result, pair.first, *pair.second);
    }

    return *result;
}